

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct16_w4_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  int iVar104;
  uint uVar105;
  undefined4 uVar106;
  uint uVar107;
  int32_t *piVar108;
  undefined8 *in_RDI;
  int iVar109;
  int iVar131;
  int iVar133;
  int iVar135;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  int iVar132;
  int iVar134;
  int iVar136;
  int iVar137;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  int iVar138;
  int iVar139;
  int iVar140;
  __m128i d0_12;
  __m128i c0_12;
  __m128i b0_12;
  __m128i a0_12;
  __m128i v0_12;
  __m128i u0_12;
  __m128i t0_12;
  __m128i d0_11;
  __m128i c0_11;
  __m128i b0_11;
  __m128i a0_11;
  __m128i v0_11;
  __m128i u0_11;
  __m128i t0_11;
  __m128i _in1_15;
  __m128i _in0_15;
  __m128i _in1_14;
  __m128i _in0_14;
  __m128i _in1_13;
  __m128i _in0_13;
  __m128i _in1_12;
  __m128i _in0_12;
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  __m128i d0_10;
  __m128i c0_10;
  __m128i b0_10;
  __m128i a0_10;
  __m128i v0_10;
  __m128i u0_10;
  __m128i t0_10;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i d0_9;
  __m128i c0_9;
  __m128i b0_9;
  __m128i a0_9;
  __m128i v0_9;
  __m128i u0_9;
  __m128i t0_9;
  __m128i d0_8;
  __m128i c0_8;
  __m128i b0_8;
  __m128i a0_8;
  __m128i v0_8;
  __m128i u0_8;
  __m128i t0_8;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d0_7;
  __m128i c0_7;
  __m128i b0_7;
  __m128i a0_7;
  __m128i v0_7;
  __m128i u0_7;
  __m128i t0_7;
  __m128i d0_6;
  __m128i c0_6;
  __m128i b0_6;
  __m128i a0_6;
  __m128i v0_6;
  __m128i u0_6;
  __m128i t0_6;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d0_5;
  __m128i c0_5;
  __m128i b0_5;
  __m128i a0_5;
  __m128i v0_5;
  __m128i u0_5;
  __m128i t0_5;
  __m128i d0_4;
  __m128i c0_4;
  __m128i b0_4;
  __m128i a0_4;
  __m128i v0_4;
  __m128i u0_4;
  __m128i t0_4;
  __m128i d0_3;
  __m128i c0_3;
  __m128i b0_3;
  __m128i a0_3;
  __m128i v0_3;
  __m128i u0_3;
  __m128i t0_3;
  __m128i d0_2;
  __m128i c0_2;
  __m128i b0_2;
  __m128i a0_2;
  __m128i v0_2;
  __m128i u0_2;
  __m128i t0_2;
  __m128i d0_1;
  __m128i c0_1;
  __m128i b0_1;
  __m128i a0_1;
  __m128i v0_1;
  __m128i u0_1;
  __m128i t0_1;
  __m128i d0;
  __m128i c0;
  __m128i b0;
  __m128i a0;
  __m128i v0;
  __m128i u0;
  __m128i t0;
  __m128i x [16];
  __m128i cospi_m32_p32;
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  __m128i cospi_p16_p48;
  __m128i cospi_p48_m16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_p40_p24;
  __m128i cospi_p24_m40;
  __m128i cospi_p08_p56;
  __m128i cospi_p56_m08;
  __m128i cospi_p52_p12;
  __m128i cospi_p12_m52;
  __m128i cospi_p20_p44;
  __m128i cospi_p44_m20;
  __m128i cospi_p36_p28;
  __m128i cospi_p28_m36;
  __m128i cospi_p04_p60;
  __m128i cospi_p60_m04;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined2 local_1548;
  undefined2 uStack_1546;
  undefined2 uStack_1544;
  undefined2 uStack_1542;
  undefined2 local_1538;
  undefined2 uStack_1536;
  undefined2 uStack_1534;
  undefined2 uStack_1532;
  undefined2 local_1528;
  undefined2 uStack_1526;
  undefined2 uStack_1524;
  undefined2 uStack_1522;
  undefined2 local_1518;
  undefined2 uStack_1516;
  undefined2 uStack_1514;
  undefined2 uStack_1512;
  undefined2 local_1508;
  undefined2 uStack_1506;
  undefined2 uStack_1504;
  undefined2 uStack_1502;
  undefined2 local_14f8;
  undefined2 uStack_14f6;
  undefined2 uStack_14f4;
  undefined2 uStack_14f2;
  undefined2 local_14e8;
  undefined2 uStack_14e6;
  undefined2 uStack_14e4;
  undefined2 uStack_14e2;
  undefined2 local_14d8;
  undefined2 uStack_14d6;
  undefined2 uStack_14d4;
  undefined2 uStack_14d2;
  undefined2 local_14c8;
  undefined2 uStack_14c6;
  undefined2 uStack_14c4;
  undefined2 uStack_14c2;
  undefined2 local_14b8;
  undefined2 uStack_14b6;
  undefined2 uStack_14b4;
  undefined2 uStack_14b2;
  undefined2 local_14a8;
  undefined2 uStack_14a6;
  undefined2 uStack_14a4;
  undefined2 uStack_14a2;
  undefined2 local_1498;
  undefined2 uStack_1496;
  undefined2 uStack_1494;
  undefined2 uStack_1492;
  undefined2 local_1488;
  undefined2 uStack_1486;
  undefined2 uStack_1484;
  undefined2 uStack_1482;
  undefined2 local_1478;
  undefined2 uStack_1476;
  undefined2 uStack_1474;
  undefined2 uStack_1472;
  undefined2 local_1468;
  undefined2 uStack_1466;
  undefined2 uStack_1464;
  undefined2 uStack_1462;
  undefined2 local_1458;
  undefined2 uStack_1456;
  undefined2 uStack_1454;
  undefined2 uStack_1452;
  undefined2 local_1448;
  undefined2 uStack_1446;
  undefined2 uStack_1444;
  undefined2 uStack_1442;
  undefined2 local_1438;
  undefined2 uStack_1436;
  undefined2 uStack_1434;
  undefined2 uStack_1432;
  undefined2 local_1428;
  undefined2 uStack_1426;
  undefined2 uStack_1424;
  undefined2 uStack_1422;
  undefined2 local_1418;
  undefined2 uStack_1416;
  undefined2 uStack_1414;
  undefined2 uStack_1412;
  undefined2 local_1408;
  undefined2 uStack_1406;
  undefined2 uStack_1404;
  undefined2 uStack_1402;
  undefined2 local_13f8;
  undefined2 uStack_13f6;
  undefined2 uStack_13f4;
  undefined2 uStack_13f2;
  undefined2 local_13e8;
  undefined2 uStack_13e6;
  undefined2 uStack_13e4;
  undefined2 uStack_13e2;
  undefined2 local_13d8;
  undefined2 uStack_13d6;
  undefined2 uStack_13d4;
  undefined2 uStack_13d2;
  undefined2 local_13c8;
  undefined2 uStack_13c6;
  undefined2 uStack_13c4;
  undefined2 uStack_13c2;
  undefined2 local_13b8;
  undefined2 uStack_13b6;
  undefined2 uStack_13b4;
  undefined2 uStack_13b2;
  int local_1058;
  int iStack_1054;
  int iStack_1050;
  int iStack_104c;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  int local_ff8;
  int iStack_ff4;
  int iStack_ff0;
  int iStack_fec;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  int local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  int local_e78;
  int iStack_e74;
  int iStack_e70;
  int iStack_e6c;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  int local_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int local_e18;
  int iStack_e14;
  int iStack_e10;
  int iStack_e0c;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_dd8;
  int iStack_dd4;
  int iStack_dd0;
  int iStack_dcc;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  
  piVar108 = cospi_arr(0xc);
  iVar104 = (uint)*(ushort *)(piVar108 + 0x3c) + piVar108[4] * -0x10000;
  auVar46._4_4_ = iVar104;
  auVar46._0_4_ = iVar104;
  auVar46._12_4_ = iVar104;
  auVar46._8_4_ = iVar104;
  uVar105 = (uint)*(ushort *)(piVar108 + 4) | piVar108[0x3c] << 0x10;
  auVar44._4_4_ = uVar105;
  auVar44._0_4_ = uVar105;
  auVar44._12_4_ = uVar105;
  auVar44._8_4_ = uVar105;
  iVar104 = (uint)*(ushort *)(piVar108 + 0x1c) + piVar108[0x24] * -0x10000;
  auVar42._4_4_ = iVar104;
  auVar42._0_4_ = iVar104;
  auVar42._12_4_ = iVar104;
  auVar42._8_4_ = iVar104;
  uVar105 = (uint)*(ushort *)(piVar108 + 0x24) | piVar108[0x1c] << 0x10;
  auVar40._4_4_ = uVar105;
  auVar40._0_4_ = uVar105;
  auVar40._12_4_ = uVar105;
  auVar40._8_4_ = uVar105;
  iVar104 = (uint)*(ushort *)(piVar108 + 0x2c) + piVar108[0x14] * -0x10000;
  auVar38._4_4_ = iVar104;
  auVar38._0_4_ = iVar104;
  auVar38._12_4_ = iVar104;
  auVar38._8_4_ = iVar104;
  uVar105 = (uint)*(ushort *)(piVar108 + 0x14) | piVar108[0x2c] << 0x10;
  auVar36._4_4_ = uVar105;
  auVar36._0_4_ = uVar105;
  auVar36._12_4_ = uVar105;
  auVar36._8_4_ = uVar105;
  iVar104 = (uint)*(ushort *)(piVar108 + 0xc) + piVar108[0x34] * -0x10000;
  auVar34._4_4_ = iVar104;
  auVar34._0_4_ = iVar104;
  auVar34._12_4_ = iVar104;
  auVar34._8_4_ = iVar104;
  uVar105 = (uint)*(ushort *)(piVar108 + 0x34) | piVar108[0xc] << 0x10;
  auVar32._4_4_ = uVar105;
  auVar32._0_4_ = uVar105;
  auVar32._12_4_ = uVar105;
  auVar32._8_4_ = uVar105;
  iVar104 = (uint)*(ushort *)(piVar108 + 0x38) + piVar108[8] * -0x10000;
  auVar30._4_4_ = iVar104;
  auVar30._0_4_ = iVar104;
  auVar30._12_4_ = iVar104;
  auVar30._8_4_ = iVar104;
  uVar105 = (uint)*(ushort *)(piVar108 + 8) | piVar108[0x38] << 0x10;
  auVar28._4_4_ = uVar105;
  auVar28._0_4_ = uVar105;
  auVar28._12_4_ = uVar105;
  auVar28._8_4_ = uVar105;
  iVar104 = (uint)*(ushort *)(piVar108 + 0x18) + piVar108[0x28] * -0x10000;
  auVar26._4_4_ = iVar104;
  auVar26._0_4_ = iVar104;
  auVar26._12_4_ = iVar104;
  auVar26._8_4_ = iVar104;
  uVar105 = (uint)*(ushort *)(piVar108 + 0x28) | piVar108[0x18] << 0x10;
  auVar122._4_4_ = uVar105;
  auVar122._0_4_ = uVar105;
  auVar122._12_4_ = uVar105;
  auVar122._8_4_ = uVar105;
  uVar106 = CONCAT22((short)piVar108[0x20],(short)piVar108[0x20]);
  uVar100 = CONCAT44(uVar106,uVar106);
  uVar101 = CONCAT44(uVar106,uVar106);
  iVar104 = (piVar108[0x20] & 0xffffU) + piVar108[0x20] * -0x10000;
  auVar124._4_4_ = iVar104;
  auVar124._0_4_ = iVar104;
  auVar124._12_4_ = iVar104;
  auVar124._8_4_ = iVar104;
  iVar104 = (uint)*(ushort *)(piVar108 + 0x30) + piVar108[0x10] * -0x10000;
  auVar128._4_4_ = iVar104;
  auVar128._0_4_ = iVar104;
  auVar128._12_4_ = iVar104;
  auVar128._8_4_ = iVar104;
  uVar105 = (uint)*(ushort *)(piVar108 + 0x10) | piVar108[0x30] << 0x10;
  auVar126._4_4_ = uVar105;
  auVar126._0_4_ = uVar105;
  auVar126._12_4_ = uVar105;
  auVar126._8_4_ = uVar105;
  uVar105 = -piVar108[0x10] & 0xffffU | piVar108[0x30] << 0x10;
  uVar107 = (uint)*(ushort *)(piVar108 + 0x30) | piVar108[0x10] << 0x10;
  auVar18._4_4_ = uVar107;
  auVar18._0_4_ = uVar107;
  auVar18._12_4_ = uVar107;
  auVar18._8_4_ = uVar107;
  iVar104 = (-piVar108[0x30] & 0xffffU) + piVar108[0x10] * -0x10000;
  auVar130._4_4_ = iVar104;
  auVar130._0_4_ = iVar104;
  auVar130._12_4_ = iVar104;
  auVar130._8_4_ = iVar104;
  uVar107 = -piVar108[0x20] & 0xffffU | piVar108[0x20] << 0x10;
  uVar102 = CONCAT44(uVar107,uVar107);
  uVar103 = CONCAT44(uVar107,uVar107);
  uVar1 = *in_RDI;
  uVar2 = in_RDI[0x10];
  uVar3 = in_RDI[8];
  uVar4 = in_RDI[0x18];
  uVar5 = in_RDI[4];
  uVar6 = in_RDI[0x14];
  uVar7 = in_RDI[0xc];
  uVar8 = in_RDI[0x1c];
  uVar9 = in_RDI[2];
  uVar10 = in_RDI[0x12];
  uVar11 = in_RDI[10];
  uVar12 = in_RDI[0x1a];
  uVar13 = in_RDI[6];
  uVar14 = in_RDI[0x16];
  uVar15 = in_RDI[0xe];
  uVar16 = in_RDI[0x1e];
  local_13b8 = (undefined2)uVar9;
  uStack_13b6 = (undefined2)((ulong)uVar9 >> 0x10);
  uStack_13b4 = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_13b2 = (undefined2)((ulong)uVar9 >> 0x30);
  local_13c8 = (undefined2)uVar16;
  uStack_13c6 = (undefined2)((ulong)uVar16 >> 0x10);
  uStack_13c4 = (undefined2)((ulong)uVar16 >> 0x20);
  uStack_13c2 = (undefined2)((ulong)uVar16 >> 0x30);
  auVar47._2_2_ = local_13c8;
  auVar47._0_2_ = local_13b8;
  auVar47._4_2_ = uStack_13b6;
  auVar47._6_2_ = uStack_13c6;
  auVar47._10_2_ = uStack_13c4;
  auVar47._8_2_ = uStack_13b4;
  auVar47._12_2_ = uStack_13b2;
  auVar47._14_2_ = uStack_13c2;
  auVar110 = pmaddwd(auVar47,auVar46);
  auVar45._2_2_ = local_13c8;
  auVar45._0_2_ = local_13b8;
  auVar45._4_2_ = uStack_13b6;
  auVar45._6_2_ = uStack_13c6;
  auVar45._10_2_ = uStack_13c4;
  auVar45._8_2_ = uStack_13b4;
  auVar45._12_2_ = uStack_13b2;
  auVar45._14_2_ = uStack_13c2;
  auVar111 = pmaddwd(auVar45,auVar44);
  local_d38 = auVar110._0_4_;
  iStack_d34 = auVar110._4_4_;
  iStack_d30 = auVar110._8_4_;
  iStack_d2c = auVar110._12_4_;
  local_d58 = auVar111._0_4_;
  iStack_d54 = auVar111._4_4_;
  iStack_d50 = auVar111._8_4_;
  iStack_d4c = auVar111._12_4_;
  auVar110 = ZEXT416(0xc);
  iVar104 = local_d38 + 0x800 >> auVar110;
  iVar131 = iStack_d34 + 0x800 >> auVar110;
  iVar133 = iStack_d30 + 0x800 >> auVar110;
  iVar136 = iStack_d2c + 0x800 >> auVar110;
  auVar110 = ZEXT416(0xc);
  iVar109 = local_d58 + 0x800 >> auVar110;
  iVar132 = iStack_d54 + 0x800 >> auVar110;
  iVar134 = iStack_d50 + 0x800 >> auVar110;
  iVar137 = iStack_d4c + 0x800 >> auVar110;
  auVar99._4_4_ = iVar131;
  auVar99._0_4_ = iVar104;
  auVar99._12_4_ = iVar136;
  auVar99._8_4_ = iVar133;
  auVar98._4_4_ = iVar131;
  auVar98._0_4_ = iVar104;
  auVar98._12_4_ = iVar136;
  auVar98._8_4_ = iVar133;
  auVar110 = packssdw(auVar99,auVar98);
  auVar97._4_4_ = iVar132;
  auVar97._0_4_ = iVar109;
  auVar97._12_4_ = iVar137;
  auVar97._8_4_ = iVar134;
  auVar96._4_4_ = iVar132;
  auVar96._0_4_ = iVar109;
  auVar96._12_4_ = iVar137;
  auVar96._8_4_ = iVar134;
  auVar111 = packssdw(auVar97,auVar96);
  local_13d8 = (undefined2)uVar10;
  uStack_13d6 = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_13d4 = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_13d2 = (undefined2)((ulong)uVar10 >> 0x30);
  local_13e8 = (undefined2)uVar15;
  uStack_13e6 = (undefined2)((ulong)uVar15 >> 0x10);
  uStack_13e4 = (undefined2)((ulong)uVar15 >> 0x20);
  uStack_13e2 = (undefined2)((ulong)uVar15 >> 0x30);
  auVar43._2_2_ = local_13e8;
  auVar43._0_2_ = local_13d8;
  auVar43._4_2_ = uStack_13d6;
  auVar43._6_2_ = uStack_13e6;
  auVar43._10_2_ = uStack_13e4;
  auVar43._8_2_ = uStack_13d4;
  auVar43._12_2_ = uStack_13d2;
  auVar43._14_2_ = uStack_13e2;
  auVar112 = pmaddwd(auVar43,auVar42);
  auVar41._2_2_ = local_13e8;
  auVar41._0_2_ = local_13d8;
  auVar41._4_2_ = uStack_13d6;
  auVar41._6_2_ = uStack_13e6;
  auVar41._10_2_ = uStack_13e4;
  auVar41._8_2_ = uStack_13d4;
  auVar41._12_2_ = uStack_13d2;
  auVar41._14_2_ = uStack_13e2;
  auVar113 = pmaddwd(auVar41,auVar40);
  local_d78 = auVar112._0_4_;
  iStack_d74 = auVar112._4_4_;
  iStack_d70 = auVar112._8_4_;
  iStack_d6c = auVar112._12_4_;
  local_d98 = auVar113._0_4_;
  iStack_d94 = auVar113._4_4_;
  iStack_d90 = auVar113._8_4_;
  iStack_d8c = auVar113._12_4_;
  auVar112 = ZEXT416(0xc);
  iVar104 = local_d78 + 0x800 >> auVar112;
  iVar131 = iStack_d74 + 0x800 >> auVar112;
  iVar133 = iStack_d70 + 0x800 >> auVar112;
  iVar136 = iStack_d6c + 0x800 >> auVar112;
  auVar112 = ZEXT416(0xc);
  iVar109 = local_d98 + 0x800 >> auVar112;
  iVar132 = iStack_d94 + 0x800 >> auVar112;
  iVar134 = iStack_d90 + 0x800 >> auVar112;
  iVar137 = iStack_d8c + 0x800 >> auVar112;
  auVar95._4_4_ = iVar131;
  auVar95._0_4_ = iVar104;
  auVar95._12_4_ = iVar136;
  auVar95._8_4_ = iVar133;
  auVar94._4_4_ = iVar131;
  auVar94._0_4_ = iVar104;
  auVar94._12_4_ = iVar136;
  auVar94._8_4_ = iVar133;
  auVar112 = packssdw(auVar95,auVar94);
  auVar93._4_4_ = iVar132;
  auVar93._0_4_ = iVar109;
  auVar93._12_4_ = iVar137;
  auVar93._8_4_ = iVar134;
  auVar92._4_4_ = iVar132;
  auVar92._0_4_ = iVar109;
  auVar92._12_4_ = iVar137;
  auVar92._8_4_ = iVar134;
  auVar113 = packssdw(auVar93,auVar92);
  local_13f8 = (undefined2)uVar11;
  uStack_13f6 = (undefined2)((ulong)uVar11 >> 0x10);
  uStack_13f4 = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_13f2 = (undefined2)((ulong)uVar11 >> 0x30);
  local_1408 = (undefined2)uVar14;
  uStack_1406 = (undefined2)((ulong)uVar14 >> 0x10);
  uStack_1404 = (undefined2)((ulong)uVar14 >> 0x20);
  uStack_1402 = (undefined2)((ulong)uVar14 >> 0x30);
  auVar39._2_2_ = local_1408;
  auVar39._0_2_ = local_13f8;
  auVar39._4_2_ = uStack_13f6;
  auVar39._6_2_ = uStack_1406;
  auVar39._10_2_ = uStack_1404;
  auVar39._8_2_ = uStack_13f4;
  auVar39._12_2_ = uStack_13f2;
  auVar39._14_2_ = uStack_1402;
  auVar114 = pmaddwd(auVar39,auVar38);
  auVar37._2_2_ = local_1408;
  auVar37._0_2_ = local_13f8;
  auVar37._4_2_ = uStack_13f6;
  auVar37._6_2_ = uStack_1406;
  auVar37._10_2_ = uStack_1404;
  auVar37._8_2_ = uStack_13f4;
  auVar37._12_2_ = uStack_13f2;
  auVar37._14_2_ = uStack_1402;
  auVar115 = pmaddwd(auVar37,auVar36);
  local_db8 = auVar114._0_4_;
  iStack_db4 = auVar114._4_4_;
  iStack_db0 = auVar114._8_4_;
  iStack_dac = auVar114._12_4_;
  local_dd8 = auVar115._0_4_;
  iStack_dd4 = auVar115._4_4_;
  iStack_dd0 = auVar115._8_4_;
  iStack_dcc = auVar115._12_4_;
  auVar114 = ZEXT416(0xc);
  iVar104 = local_db8 + 0x800 >> auVar114;
  iVar131 = iStack_db4 + 0x800 >> auVar114;
  iVar133 = iStack_db0 + 0x800 >> auVar114;
  iVar136 = iStack_dac + 0x800 >> auVar114;
  auVar114 = ZEXT416(0xc);
  iVar109 = local_dd8 + 0x800 >> auVar114;
  iVar132 = iStack_dd4 + 0x800 >> auVar114;
  iVar134 = iStack_dd0 + 0x800 >> auVar114;
  iVar137 = iStack_dcc + 0x800 >> auVar114;
  auVar91._4_4_ = iVar131;
  auVar91._0_4_ = iVar104;
  auVar91._12_4_ = iVar136;
  auVar91._8_4_ = iVar133;
  auVar90._4_4_ = iVar131;
  auVar90._0_4_ = iVar104;
  auVar90._12_4_ = iVar136;
  auVar90._8_4_ = iVar133;
  auVar114 = packssdw(auVar91,auVar90);
  auVar89._4_4_ = iVar132;
  auVar89._0_4_ = iVar109;
  auVar89._12_4_ = iVar137;
  auVar89._8_4_ = iVar134;
  auVar88._4_4_ = iVar132;
  auVar88._0_4_ = iVar109;
  auVar88._12_4_ = iVar137;
  auVar88._8_4_ = iVar134;
  auVar115 = packssdw(auVar89,auVar88);
  local_1418 = (undefined2)uVar12;
  uStack_1416 = (undefined2)((ulong)uVar12 >> 0x10);
  uStack_1414 = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_1412 = (undefined2)((ulong)uVar12 >> 0x30);
  local_1428 = (undefined2)uVar13;
  uStack_1426 = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_1424 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_1422 = (undefined2)((ulong)uVar13 >> 0x30);
  auVar35._2_2_ = local_1428;
  auVar35._0_2_ = local_1418;
  auVar35._4_2_ = uStack_1416;
  auVar35._6_2_ = uStack_1426;
  auVar35._10_2_ = uStack_1424;
  auVar35._8_2_ = uStack_1414;
  auVar35._12_2_ = uStack_1412;
  auVar35._14_2_ = uStack_1422;
  auVar116 = pmaddwd(auVar35,auVar34);
  auVar33._2_2_ = local_1428;
  auVar33._0_2_ = local_1418;
  auVar33._4_2_ = uStack_1416;
  auVar33._6_2_ = uStack_1426;
  auVar33._10_2_ = uStack_1424;
  auVar33._8_2_ = uStack_1414;
  auVar33._12_2_ = uStack_1412;
  auVar33._14_2_ = uStack_1422;
  auVar117 = pmaddwd(auVar33,auVar32);
  local_df8 = auVar116._0_4_;
  iStack_df4 = auVar116._4_4_;
  iStack_df0 = auVar116._8_4_;
  iStack_dec = auVar116._12_4_;
  local_e18 = auVar117._0_4_;
  iStack_e14 = auVar117._4_4_;
  iStack_e10 = auVar117._8_4_;
  iStack_e0c = auVar117._12_4_;
  auVar116 = ZEXT416(0xc);
  iVar104 = local_df8 + 0x800 >> auVar116;
  iVar131 = iStack_df4 + 0x800 >> auVar116;
  iVar133 = iStack_df0 + 0x800 >> auVar116;
  iVar136 = iStack_dec + 0x800 >> auVar116;
  auVar116 = ZEXT416(0xc);
  iVar109 = local_e18 + 0x800 >> auVar116;
  iVar132 = iStack_e14 + 0x800 >> auVar116;
  iVar134 = iStack_e10 + 0x800 >> auVar116;
  iVar137 = iStack_e0c + 0x800 >> auVar116;
  auVar87._4_4_ = iVar131;
  auVar87._0_4_ = iVar104;
  auVar87._12_4_ = iVar136;
  auVar87._8_4_ = iVar133;
  auVar86._4_4_ = iVar131;
  auVar86._0_4_ = iVar104;
  auVar86._12_4_ = iVar136;
  auVar86._8_4_ = iVar133;
  auVar116 = packssdw(auVar87,auVar86);
  auVar85._4_4_ = iVar132;
  auVar85._0_4_ = iVar109;
  auVar85._12_4_ = iVar137;
  auVar85._8_4_ = iVar134;
  auVar84._4_4_ = iVar132;
  auVar84._0_4_ = iVar109;
  auVar84._12_4_ = iVar137;
  auVar84._8_4_ = iVar134;
  auVar117 = packssdw(auVar85,auVar84);
  local_1438 = (undefined2)uVar5;
  uStack_1436 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_1434 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_1432 = (undefined2)((ulong)uVar5 >> 0x30);
  local_1448 = (undefined2)uVar8;
  uStack_1446 = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_1444 = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_1442 = (undefined2)((ulong)uVar8 >> 0x30);
  auVar31._2_2_ = local_1448;
  auVar31._0_2_ = local_1438;
  auVar31._4_2_ = uStack_1436;
  auVar31._6_2_ = uStack_1446;
  auVar31._10_2_ = uStack_1444;
  auVar31._8_2_ = uStack_1434;
  auVar31._12_2_ = uStack_1432;
  auVar31._14_2_ = uStack_1442;
  auVar118 = pmaddwd(auVar31,auVar30);
  auVar29._2_2_ = local_1448;
  auVar29._0_2_ = local_1438;
  auVar29._4_2_ = uStack_1436;
  auVar29._6_2_ = uStack_1446;
  auVar29._10_2_ = uStack_1444;
  auVar29._8_2_ = uStack_1434;
  auVar29._12_2_ = uStack_1432;
  auVar29._14_2_ = uStack_1442;
  auVar119 = pmaddwd(auVar29,auVar28);
  local_e38 = auVar118._0_4_;
  iStack_e34 = auVar118._4_4_;
  iStack_e30 = auVar118._8_4_;
  iStack_e2c = auVar118._12_4_;
  local_e58 = auVar119._0_4_;
  iStack_e54 = auVar119._4_4_;
  iStack_e50 = auVar119._8_4_;
  iStack_e4c = auVar119._12_4_;
  auVar118 = ZEXT416(0xc);
  iVar104 = local_e38 + 0x800 >> auVar118;
  iVar131 = iStack_e34 + 0x800 >> auVar118;
  iVar133 = iStack_e30 + 0x800 >> auVar118;
  iVar136 = iStack_e2c + 0x800 >> auVar118;
  auVar118 = ZEXT416(0xc);
  iVar109 = local_e58 + 0x800 >> auVar118;
  iVar132 = iStack_e54 + 0x800 >> auVar118;
  iVar134 = iStack_e50 + 0x800 >> auVar118;
  iVar137 = iStack_e4c + 0x800 >> auVar118;
  auVar83._4_4_ = iVar131;
  auVar83._0_4_ = iVar104;
  auVar83._12_4_ = iVar136;
  auVar83._8_4_ = iVar133;
  auVar82._4_4_ = iVar131;
  auVar82._0_4_ = iVar104;
  auVar82._12_4_ = iVar136;
  auVar82._8_4_ = iVar133;
  auVar118 = packssdw(auVar83,auVar82);
  auVar81._4_4_ = iVar132;
  auVar81._0_4_ = iVar109;
  auVar81._12_4_ = iVar137;
  auVar81._8_4_ = iVar134;
  auVar80._4_4_ = iVar132;
  auVar80._0_4_ = iVar109;
  auVar80._12_4_ = iVar137;
  auVar80._8_4_ = iVar134;
  auVar119 = packssdw(auVar81,auVar80);
  local_1458 = (undefined2)uVar6;
  uStack_1456 = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_1454 = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_1452 = (undefined2)((ulong)uVar6 >> 0x30);
  local_1468 = (undefined2)uVar7;
  uStack_1466 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_1464 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_1462 = (undefined2)((ulong)uVar7 >> 0x30);
  auVar27._2_2_ = local_1468;
  auVar27._0_2_ = local_1458;
  auVar27._4_2_ = uStack_1456;
  auVar27._6_2_ = uStack_1466;
  auVar27._10_2_ = uStack_1464;
  auVar27._8_2_ = uStack_1454;
  auVar27._12_2_ = uStack_1452;
  auVar27._14_2_ = uStack_1462;
  auVar120 = pmaddwd(auVar27,auVar26);
  auVar25._2_2_ = local_1468;
  auVar25._0_2_ = local_1458;
  auVar25._4_2_ = uStack_1456;
  auVar25._6_2_ = uStack_1466;
  auVar25._10_2_ = uStack_1464;
  auVar25._8_2_ = uStack_1454;
  auVar25._12_2_ = uStack_1452;
  auVar25._14_2_ = uStack_1462;
  auVar121 = pmaddwd(auVar25,auVar122);
  local_e78 = auVar120._0_4_;
  iStack_e74 = auVar120._4_4_;
  iStack_e70 = auVar120._8_4_;
  iStack_e6c = auVar120._12_4_;
  local_e98 = auVar121._0_4_;
  iStack_e94 = auVar121._4_4_;
  iStack_e90 = auVar121._8_4_;
  iStack_e8c = auVar121._12_4_;
  auVar120 = ZEXT416(0xc);
  iVar104 = local_e78 + 0x800 >> auVar120;
  iVar131 = iStack_e74 + 0x800 >> auVar120;
  iVar133 = iStack_e70 + 0x800 >> auVar120;
  iVar136 = iStack_e6c + 0x800 >> auVar120;
  auVar120 = ZEXT416(0xc);
  iVar109 = local_e98 + 0x800 >> auVar120;
  iVar132 = iStack_e94 + 0x800 >> auVar120;
  iVar134 = iStack_e90 + 0x800 >> auVar120;
  iVar137 = iStack_e8c + 0x800 >> auVar120;
  auVar79._4_4_ = iVar131;
  auVar79._0_4_ = iVar104;
  auVar79._12_4_ = iVar136;
  auVar79._8_4_ = iVar133;
  auVar78._4_4_ = iVar131;
  auVar78._0_4_ = iVar104;
  auVar78._12_4_ = iVar136;
  auVar78._8_4_ = iVar133;
  auVar120 = packssdw(auVar79,auVar78);
  auVar77._4_4_ = iVar132;
  auVar77._0_4_ = iVar109;
  auVar77._12_4_ = iVar137;
  auVar77._8_4_ = iVar134;
  auVar76._4_4_ = iVar132;
  auVar76._0_4_ = iVar109;
  auVar76._12_4_ = iVar137;
  auVar76._8_4_ = iVar134;
  auVar121 = packssdw(auVar77,auVar76);
  auVar122 = paddsw(auVar110,auVar112);
  auVar110 = psubsw(auVar110,auVar112);
  auVar112 = psubsw(auVar116,auVar114);
  auVar114 = paddsw(auVar116,auVar114);
  auVar116 = paddsw(auVar117,auVar115);
  auVar115 = psubsw(auVar117,auVar115);
  auVar117 = psubsw(auVar111,auVar113);
  auVar111 = paddsw(auVar111,auVar113);
  local_1478 = (undefined2)uVar1;
  uStack_1476 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1474 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1472 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1488 = (undefined2)uVar2;
  uStack_1486 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1484 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1482 = (undefined2)((ulong)uVar2 >> 0x30);
  auVar24._2_2_ = local_1488;
  auVar24._0_2_ = local_1478;
  auVar24._4_2_ = uStack_1476;
  auVar24._6_2_ = uStack_1486;
  auVar24._10_2_ = uStack_1484;
  auVar24._8_2_ = uStack_1474;
  auVar24._12_2_ = uStack_1472;
  auVar24._14_2_ = uStack_1482;
  auVar23._8_8_ = uVar101;
  auVar23._0_8_ = uVar100;
  auVar113 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = local_1488;
  auVar22._0_2_ = local_1478;
  auVar22._4_2_ = uStack_1476;
  auVar22._6_2_ = uStack_1486;
  auVar22._10_2_ = uStack_1484;
  auVar22._8_2_ = uStack_1474;
  auVar22._12_2_ = uStack_1472;
  auVar22._14_2_ = uStack_1482;
  auVar123 = pmaddwd(auVar22,auVar124);
  local_eb8 = auVar113._0_4_;
  iStack_eb4 = auVar113._4_4_;
  iStack_eb0 = auVar113._8_4_;
  iStack_eac = auVar113._12_4_;
  local_ed8 = auVar123._0_4_;
  iStack_ed4 = auVar123._4_4_;
  iStack_ed0 = auVar123._8_4_;
  iStack_ecc = auVar123._12_4_;
  auVar113 = ZEXT416(0xc);
  iVar104 = local_eb8 + 0x800 >> auVar113;
  iVar131 = iStack_eb4 + 0x800 >> auVar113;
  iVar133 = iStack_eb0 + 0x800 >> auVar113;
  iVar136 = iStack_eac + 0x800 >> auVar113;
  auVar113 = ZEXT416(0xc);
  iVar109 = local_ed8 + 0x800 >> auVar113;
  iVar132 = iStack_ed4 + 0x800 >> auVar113;
  iVar134 = iStack_ed0 + 0x800 >> auVar113;
  iVar137 = iStack_ecc + 0x800 >> auVar113;
  auVar75._4_4_ = iVar131;
  auVar75._0_4_ = iVar104;
  auVar75._12_4_ = iVar136;
  auVar75._8_4_ = iVar133;
  auVar74._4_4_ = iVar131;
  auVar74._0_4_ = iVar104;
  auVar74._12_4_ = iVar136;
  auVar74._8_4_ = iVar133;
  auVar113 = packssdw(auVar75,auVar74);
  auVar73._4_4_ = iVar132;
  auVar73._0_4_ = iVar109;
  auVar73._12_4_ = iVar137;
  auVar73._8_4_ = iVar134;
  auVar72._4_4_ = iVar132;
  auVar72._0_4_ = iVar109;
  auVar72._12_4_ = iVar137;
  auVar72._8_4_ = iVar134;
  auVar124 = packssdw(auVar73,auVar72);
  local_1498 = (undefined2)uVar3;
  uStack_1496 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_1494 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_1492 = (undefined2)((ulong)uVar3 >> 0x30);
  local_14a8 = (undefined2)uVar4;
  uStack_14a6 = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_14a4 = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_14a2 = (undefined2)((ulong)uVar4 >> 0x30);
  auVar129._2_2_ = local_14a8;
  auVar129._0_2_ = local_1498;
  auVar129._4_2_ = uStack_1496;
  auVar129._6_2_ = uStack_14a6;
  auVar129._10_2_ = uStack_14a4;
  auVar129._8_2_ = uStack_1494;
  auVar129._12_2_ = uStack_1492;
  auVar129._14_2_ = uStack_14a2;
  auVar123 = pmaddwd(auVar129,auVar128);
  auVar127._2_2_ = local_14a8;
  auVar127._0_2_ = local_1498;
  auVar127._4_2_ = uStack_1496;
  auVar127._6_2_ = uStack_14a6;
  auVar127._10_2_ = uStack_14a4;
  auVar127._8_2_ = uStack_1494;
  auVar127._12_2_ = uStack_1492;
  auVar127._14_2_ = uStack_14a2;
  auVar125 = pmaddwd(auVar127,auVar126);
  local_ef8 = auVar123._0_4_;
  iStack_ef4 = auVar123._4_4_;
  iStack_ef0 = auVar123._8_4_;
  iStack_eec = auVar123._12_4_;
  local_f18 = auVar125._0_4_;
  iStack_f14 = auVar125._4_4_;
  iStack_f10 = auVar125._8_4_;
  iStack_f0c = auVar125._12_4_;
  auVar123 = ZEXT416(0xc);
  iVar104 = local_ef8 + 0x800 >> auVar123;
  iVar131 = iStack_ef4 + 0x800 >> auVar123;
  iVar133 = iStack_ef0 + 0x800 >> auVar123;
  iVar136 = iStack_eec + 0x800 >> auVar123;
  auVar123 = ZEXT416(0xc);
  iVar109 = local_f18 + 0x800 >> auVar123;
  iVar132 = iStack_f14 + 0x800 >> auVar123;
  iVar134 = iStack_f10 + 0x800 >> auVar123;
  iVar137 = iStack_f0c + 0x800 >> auVar123;
  auVar71._4_4_ = iVar131;
  auVar71._0_4_ = iVar104;
  auVar71._12_4_ = iVar136;
  auVar71._8_4_ = iVar133;
  auVar70._4_4_ = iVar131;
  auVar70._0_4_ = iVar104;
  auVar70._12_4_ = iVar136;
  auVar70._8_4_ = iVar133;
  auVar126 = packssdw(auVar71,auVar70);
  auVar69._4_4_ = iVar132;
  auVar69._0_4_ = iVar109;
  auVar69._12_4_ = iVar137;
  auVar69._8_4_ = iVar134;
  auVar68._4_4_ = iVar132;
  auVar68._0_4_ = iVar109;
  auVar68._12_4_ = iVar137;
  auVar68._8_4_ = iVar134;
  auVar127 = packssdw(auVar69,auVar68);
  auVar128 = paddsw(auVar118,auVar120);
  auVar118 = psubsw(auVar118,auVar120);
  auVar120 = psubsw(auVar119,auVar121);
  auVar129 = paddsw(auVar119,auVar121);
  local_14b8 = auVar110._0_2_;
  uStack_14b6 = auVar110._2_2_;
  uStack_14b4 = auVar110._4_2_;
  uStack_14b2 = auVar110._6_2_;
  local_14c8 = auVar117._0_2_;
  uStack_14c6 = auVar117._2_2_;
  uStack_14c4 = auVar117._4_2_;
  uStack_14c2 = auVar117._6_2_;
  auVar21._2_2_ = local_14c8;
  auVar21._0_2_ = local_14b8;
  auVar21._4_2_ = uStack_14b6;
  auVar21._6_2_ = uStack_14c6;
  auVar21._10_2_ = uStack_14c4;
  auVar21._8_2_ = uStack_14b4;
  auVar21._12_2_ = uStack_14b2;
  auVar21._14_2_ = uStack_14c2;
  auVar20._8_8_ = CONCAT44(uVar105,uVar105);
  auVar20._0_8_ = CONCAT44(uVar105,uVar105);
  auVar110 = pmaddwd(auVar21,auVar20);
  auVar19._2_2_ = local_14c8;
  auVar19._0_2_ = local_14b8;
  auVar19._4_2_ = uStack_14b6;
  auVar19._6_2_ = uStack_14c6;
  auVar19._10_2_ = uStack_14c4;
  auVar19._8_2_ = uStack_14b4;
  auVar19._12_2_ = uStack_14b2;
  auVar19._14_2_ = uStack_14c2;
  auVar117 = pmaddwd(auVar19,auVar18);
  local_f38 = auVar110._0_4_;
  iStack_f34 = auVar110._4_4_;
  iStack_f30 = auVar110._8_4_;
  iStack_f2c = auVar110._12_4_;
  local_f58 = auVar117._0_4_;
  iStack_f54 = auVar117._4_4_;
  iStack_f50 = auVar117._8_4_;
  iStack_f4c = auVar117._12_4_;
  auVar110 = ZEXT416(0xc);
  iVar104 = local_f38 + 0x800 >> auVar110;
  iVar131 = iStack_f34 + 0x800 >> auVar110;
  iVar133 = iStack_f30 + 0x800 >> auVar110;
  iVar136 = iStack_f2c + 0x800 >> auVar110;
  auVar110 = ZEXT416(0xc);
  iVar109 = local_f58 + 0x800 >> auVar110;
  iVar132 = iStack_f54 + 0x800 >> auVar110;
  iVar134 = iStack_f50 + 0x800 >> auVar110;
  iVar137 = iStack_f4c + 0x800 >> auVar110;
  auVar67._4_4_ = iVar131;
  auVar67._0_4_ = iVar104;
  auVar67._12_4_ = iVar136;
  auVar67._8_4_ = iVar133;
  auVar66._4_4_ = iVar131;
  auVar66._0_4_ = iVar104;
  auVar66._12_4_ = iVar136;
  auVar66._8_4_ = iVar133;
  auVar110 = packssdw(auVar67,auVar66);
  auVar65._4_4_ = iVar132;
  auVar65._0_4_ = iVar109;
  auVar65._12_4_ = iVar137;
  auVar65._8_4_ = iVar134;
  auVar64._4_4_ = iVar132;
  auVar64._0_4_ = iVar109;
  auVar64._12_4_ = iVar137;
  auVar64._8_4_ = iVar134;
  auVar117 = packssdw(auVar65,auVar64);
  local_14d8 = auVar112._0_2_;
  uStack_14d6 = auVar112._2_2_;
  uStack_14d4 = auVar112._4_2_;
  uStack_14d2 = auVar112._6_2_;
  local_14e8 = auVar115._0_2_;
  uStack_14e6 = auVar115._2_2_;
  uStack_14e4 = auVar115._4_2_;
  uStack_14e2 = auVar115._6_2_;
  auVar17._2_2_ = local_14e8;
  auVar17._0_2_ = local_14d8;
  auVar17._4_2_ = uStack_14d6;
  auVar17._6_2_ = uStack_14e6;
  auVar17._10_2_ = uStack_14e4;
  auVar17._8_2_ = uStack_14d4;
  auVar17._12_2_ = uStack_14d2;
  auVar17._14_2_ = uStack_14e2;
  auVar112 = pmaddwd(auVar17,auVar130);
  auVar125._2_2_ = local_14e8;
  auVar125._0_2_ = local_14d8;
  auVar125._4_2_ = uStack_14d6;
  auVar125._6_2_ = uStack_14e6;
  auVar125._10_2_ = uStack_14e4;
  auVar125._8_2_ = uStack_14d4;
  auVar125._12_2_ = uStack_14d2;
  auVar125._14_2_ = uStack_14e2;
  auVar123._8_8_ = CONCAT44(uVar105,uVar105);
  auVar123._0_8_ = CONCAT44(uVar105,uVar105);
  auVar115 = pmaddwd(auVar125,auVar123);
  local_f78 = auVar112._0_4_;
  iStack_f74 = auVar112._4_4_;
  iStack_f70 = auVar112._8_4_;
  iStack_f6c = auVar112._12_4_;
  local_f98 = auVar115._0_4_;
  iStack_f94 = auVar115._4_4_;
  iStack_f90 = auVar115._8_4_;
  iStack_f8c = auVar115._12_4_;
  auVar112 = ZEXT416(0xc);
  iVar104 = local_f78 + 0x800 >> auVar112;
  iVar131 = iStack_f74 + 0x800 >> auVar112;
  iVar133 = iStack_f70 + 0x800 >> auVar112;
  iVar136 = iStack_f6c + 0x800 >> auVar112;
  auVar112 = ZEXT416(0xc);
  iVar109 = local_f98 + 0x800 >> auVar112;
  iVar132 = iStack_f94 + 0x800 >> auVar112;
  iVar134 = iStack_f90 + 0x800 >> auVar112;
  iVar137 = iStack_f8c + 0x800 >> auVar112;
  auVar63._4_4_ = iVar131;
  auVar63._0_4_ = iVar104;
  auVar63._12_4_ = iVar136;
  auVar63._8_4_ = iVar133;
  auVar62._4_4_ = iVar131;
  auVar62._0_4_ = iVar104;
  auVar62._12_4_ = iVar136;
  auVar62._8_4_ = iVar133;
  auVar112 = packssdw(auVar63,auVar62);
  auVar61._4_4_ = iVar132;
  auVar61._0_4_ = iVar109;
  auVar61._12_4_ = iVar137;
  auVar61._8_4_ = iVar134;
  auVar60._4_4_ = iVar132;
  auVar60._0_4_ = iVar109;
  auVar60._12_4_ = iVar137;
  auVar60._8_4_ = iVar134;
  auVar115 = packssdw(auVar61,auVar60);
  auVar123 = paddsw(auVar113,auVar127);
  auVar113 = psubsw(auVar113,auVar127);
  auVar125 = paddsw(auVar124,auVar126);
  auVar130 = psubsw(auVar124,auVar126);
  local_14f8 = auVar118._0_2_;
  uStack_14f6 = auVar118._2_2_;
  uStack_14f4 = auVar118._4_2_;
  uStack_14f2 = auVar118._6_2_;
  local_1508 = auVar120._0_2_;
  uStack_1506 = auVar120._2_2_;
  uStack_1504 = auVar120._4_2_;
  uStack_1502 = auVar120._6_2_;
  auVar121._2_2_ = local_1508;
  auVar121._0_2_ = local_14f8;
  auVar121._4_2_ = uStack_14f6;
  auVar121._6_2_ = uStack_1506;
  auVar121._10_2_ = uStack_1504;
  auVar121._8_2_ = uStack_14f4;
  auVar121._12_2_ = uStack_14f2;
  auVar121._14_2_ = uStack_1502;
  auVar120._8_8_ = uVar103;
  auVar120._0_8_ = uVar102;
  auVar120 = pmaddwd(auVar121,auVar120);
  auVar119._2_2_ = local_1508;
  auVar119._0_2_ = local_14f8;
  auVar119._4_2_ = uStack_14f6;
  auVar119._6_2_ = uStack_1506;
  auVar119._10_2_ = uStack_1504;
  auVar119._8_2_ = uStack_14f4;
  auVar119._12_2_ = uStack_14f2;
  auVar119._14_2_ = uStack_1502;
  auVar118._8_8_ = uVar101;
  auVar118._0_8_ = uVar100;
  auVar118 = pmaddwd(auVar119,auVar118);
  local_fb8 = auVar120._0_4_;
  iStack_fb4 = auVar120._4_4_;
  iStack_fb0 = auVar120._8_4_;
  iStack_fac = auVar120._12_4_;
  local_fd8 = auVar118._0_4_;
  iStack_fd4 = auVar118._4_4_;
  iStack_fd0 = auVar118._8_4_;
  iStack_fcc = auVar118._12_4_;
  auVar118 = ZEXT416(0xc);
  iVar104 = local_fb8 + 0x800 >> auVar118;
  iVar131 = iStack_fb4 + 0x800 >> auVar118;
  iVar133 = iStack_fb0 + 0x800 >> auVar118;
  iVar136 = iStack_fac + 0x800 >> auVar118;
  auVar118 = ZEXT416(0xc);
  iVar109 = local_fd8 + 0x800 >> auVar118;
  iVar132 = iStack_fd4 + 0x800 >> auVar118;
  iVar134 = iStack_fd0 + 0x800 >> auVar118;
  iVar137 = iStack_fcc + 0x800 >> auVar118;
  auVar59._4_4_ = iVar131;
  auVar59._0_4_ = iVar104;
  auVar59._12_4_ = iVar136;
  auVar59._8_4_ = iVar133;
  auVar58._4_4_ = iVar131;
  auVar58._0_4_ = iVar104;
  auVar58._12_4_ = iVar136;
  auVar58._8_4_ = iVar133;
  auVar118 = packssdw(auVar59,auVar58);
  auVar57._4_4_ = iVar132;
  auVar57._0_4_ = iVar109;
  auVar57._12_4_ = iVar137;
  auVar57._8_4_ = iVar134;
  auVar56._4_4_ = iVar132;
  auVar56._0_4_ = iVar109;
  auVar56._12_4_ = iVar137;
  auVar56._8_4_ = iVar134;
  auVar119 = packssdw(auVar57,auVar56);
  paddsw(auVar122,auVar114);
  auVar120 = psubsw(auVar122,auVar114);
  paddsw(auVar110,auVar112);
  auVar110 = psubsw(auVar110,auVar112);
  auVar112 = psubsw(auVar111,auVar116);
  paddsw(auVar111,auVar116);
  auVar111 = psubsw(auVar117,auVar115);
  paddsw(auVar117,auVar115);
  paddsw(auVar123,auVar129);
  psubsw(auVar123,auVar129);
  paddsw(auVar125,auVar119);
  psubsw(auVar125,auVar119);
  paddsw(auVar130,auVar118);
  psubsw(auVar130,auVar118);
  paddsw(auVar113,auVar128);
  psubsw(auVar113,auVar128);
  local_1518 = auVar110._0_2_;
  uStack_1516 = auVar110._2_2_;
  uStack_1514 = auVar110._4_2_;
  uStack_1512 = auVar110._6_2_;
  local_1528 = auVar111._0_2_;
  uStack_1526 = auVar111._2_2_;
  uStack_1524 = auVar111._4_2_;
  uStack_1522 = auVar111._6_2_;
  auVar117._2_2_ = local_1528;
  auVar117._0_2_ = local_1518;
  auVar117._4_2_ = uStack_1516;
  auVar117._6_2_ = uStack_1526;
  auVar117._10_2_ = uStack_1524;
  auVar117._8_2_ = uStack_1514;
  auVar117._12_2_ = uStack_1512;
  auVar117._14_2_ = uStack_1522;
  auVar116._8_8_ = uVar103;
  auVar116._0_8_ = uVar102;
  auVar110 = pmaddwd(auVar117,auVar116);
  auVar115._2_2_ = local_1528;
  auVar115._0_2_ = local_1518;
  auVar115._4_2_ = uStack_1516;
  auVar115._6_2_ = uStack_1526;
  auVar115._10_2_ = uStack_1524;
  auVar115._8_2_ = uStack_1514;
  auVar115._12_2_ = uStack_1512;
  auVar115._14_2_ = uStack_1522;
  auVar114._8_8_ = uVar101;
  auVar114._0_8_ = uVar100;
  auVar111 = pmaddwd(auVar115,auVar114);
  local_ff8 = auVar110._0_4_;
  iStack_ff4 = auVar110._4_4_;
  iStack_ff0 = auVar110._8_4_;
  iStack_fec = auVar110._12_4_;
  local_1018 = auVar111._0_4_;
  iStack_1014 = auVar111._4_4_;
  iStack_1010 = auVar111._8_4_;
  iStack_100c = auVar111._12_4_;
  auVar110 = ZEXT416(0xc);
  iVar104 = local_ff8 + 0x800 >> auVar110;
  iVar132 = iStack_ff4 + 0x800 >> auVar110;
  iVar133 = iStack_ff0 + 0x800 >> auVar110;
  iVar134 = iStack_fec + 0x800 >> auVar110;
  auVar110 = ZEXT416(0xc);
  iVar109 = local_1018 + 0x800 >> auVar110;
  iVar131 = iStack_1014 + 0x800 >> auVar110;
  iVar136 = iStack_1010 + 0x800 >> auVar110;
  iVar138 = iStack_100c + 0x800 >> auVar110;
  auVar55._4_4_ = iVar132;
  auVar55._0_4_ = iVar104;
  auVar55._12_4_ = iVar134;
  auVar55._8_4_ = iVar133;
  auVar54._4_4_ = iVar132;
  auVar54._0_4_ = iVar104;
  auVar54._12_4_ = iVar134;
  auVar54._8_4_ = iVar133;
  packssdw(auVar55,auVar54);
  auVar53._4_4_ = iVar131;
  auVar53._0_4_ = iVar109;
  auVar53._12_4_ = iVar138;
  auVar53._8_4_ = iVar136;
  auVar52._4_4_ = iVar131;
  auVar52._0_4_ = iVar109;
  auVar52._12_4_ = iVar138;
  auVar52._8_4_ = iVar136;
  packssdw(auVar53,auVar52);
  local_1538 = auVar120._0_2_;
  uStack_1536 = auVar120._2_2_;
  uStack_1534 = auVar120._4_2_;
  uStack_1532 = auVar120._6_2_;
  local_1548 = auVar112._0_2_;
  uStack_1546 = auVar112._2_2_;
  uStack_1544 = auVar112._4_2_;
  uStack_1542 = auVar112._6_2_;
  auVar113._2_2_ = local_1548;
  auVar113._0_2_ = local_1538;
  auVar113._4_2_ = uStack_1536;
  auVar113._6_2_ = uStack_1546;
  auVar113._10_2_ = uStack_1544;
  auVar113._8_2_ = uStack_1534;
  auVar113._12_2_ = uStack_1532;
  auVar113._14_2_ = uStack_1542;
  auVar112._8_8_ = uVar103;
  auVar112._0_8_ = uVar102;
  auVar112 = pmaddwd(auVar113,auVar112);
  auVar111._2_2_ = local_1548;
  auVar111._0_2_ = local_1538;
  auVar111._4_2_ = uStack_1536;
  auVar111._6_2_ = uStack_1546;
  auVar111._10_2_ = uStack_1544;
  auVar111._8_2_ = uStack_1534;
  auVar111._12_2_ = uStack_1532;
  auVar111._14_2_ = uStack_1542;
  auVar110._8_8_ = uVar101;
  auVar110._0_8_ = uVar100;
  auVar110 = pmaddwd(auVar111,auVar110);
  local_1038 = auVar112._0_4_;
  iStack_1034 = auVar112._4_4_;
  iStack_1030 = auVar112._8_4_;
  iStack_102c = auVar112._12_4_;
  local_1058 = auVar110._0_4_;
  iStack_1054 = auVar110._4_4_;
  iStack_1050 = auVar110._8_4_;
  iStack_104c = auVar110._12_4_;
  auVar110 = ZEXT416(0xc);
  iVar109 = local_1038 + 0x800 >> auVar110;
  iVar133 = iStack_1034 + 0x800 >> auVar110;
  iVar137 = iStack_1030 + 0x800 >> auVar110;
  iVar139 = iStack_102c + 0x800 >> auVar110;
  auVar110 = ZEXT416(0xc);
  iVar131 = local_1058 + 0x800 >> auVar110;
  iVar134 = iStack_1054 + 0x800 >> auVar110;
  iVar135 = iStack_1050 + 0x800 >> auVar110;
  iVar140 = iStack_104c + 0x800 >> auVar110;
  auVar51._4_4_ = iVar133;
  auVar51._0_4_ = iVar109;
  auVar51._12_4_ = iVar139;
  auVar51._8_4_ = iVar137;
  auVar50._4_4_ = iVar133;
  auVar50._0_4_ = iVar109;
  auVar50._12_4_ = iVar139;
  auVar50._8_4_ = iVar137;
  packssdw(auVar51,auVar50);
  auVar49._4_4_ = iVar134;
  auVar49._0_4_ = iVar131;
  auVar49._12_4_ = iVar140;
  auVar49._8_4_ = iVar135;
  auVar48._4_4_ = iVar134;
  auVar48._0_4_ = iVar131;
  auVar48._12_4_ = iVar140;
  auVar48._8_4_ = iVar135;
  packssdw(auVar49,auVar48);
  idct16_stage7_sse2((__m128i *)CONCAT44(iVar132,iVar104),(__m128i *)CONCAT44(iVar138,iVar136));
  return;
}

Assistant:

static void idct16_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[1] = input[8];
  x[2] = input[4];
  x[3] = input[12];
  x[4] = input[2];
  x[5] = input[10];
  x[6] = input[6];
  x[7] = input[14];
  x[8] = input[1];
  x[9] = input[9];
  x[10] = input[5];
  x[11] = input[13];
  x[12] = input[3];
  x[13] = input[11];
  x[14] = input[7];
  x[15] = input[15];

  // stage 2
  btf_16_4p_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_4p_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_4p_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_4p_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);

  // stage 3
  btf_16_4p_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_4p_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_4p_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_4p_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  // stage 5
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);

  // stage 6
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);

  // stage 7
  idct16_stage7_sse2(output, x);
}